

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksToSubprojects
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml,string *baseDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  pointer pcVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  string *psVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string linkSourceDirectory;
  string linkName;
  string local_98;
  string local_78;
  cmXMLWriter *local_58;
  string local_50;
  
  if (this->GenerateLinkedResources == true) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_58 = xml;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"[Subprojects]","");
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"virtual:/virtual","");
    AppendLinkedResource(local_58,&local_98,&local_78,VirtualFolder);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,(ulong)(local_98.field_2._M_allocated_capacity + 1))
      ;
    }
    pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var7 = (pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var8) {
      do {
        psVar6 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_
                           ((cmLocalGenerator *)**(undefined8 **)(p_Var7 + 2));
        pcVar3 = (psVar6->_M_dataplus)._M_p;
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar3,pcVar3 + psVar6->_M_string_length);
        __n = baseDir->_M_string_length;
        if (__n == local_78._M_string_length) {
          if (__n != 0) {
            iVar5 = bcmp((baseDir->_M_dataplus)._M_p,local_78._M_dataplus._M_p,__n);
            if (iVar5 != 0) goto LAB_003fcb03;
          }
        }
        else {
LAB_003fcb03:
          bVar4 = cmsys::SystemTools::IsSubDirectory(baseDir,&local_78);
          if (!bVar4) {
            local_98.field_2._8_8_ = *(undefined8 *)(p_Var7 + 1);
            local_98.field_2._M_allocated_capacity = (size_type)p_Var7[1]._M_parent;
            local_98._M_dataplus._M_p = (pointer)0xe;
            local_98._M_string_length = 0x7222fd;
            views._M_len = 2;
            views._M_array = (iterator)&local_98;
            cmCatViews_abi_cxx11_(&local_50,views);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,local_78._M_dataplus._M_p,
                       local_78._M_dataplus._M_p + local_78._M_string_length);
            AppendLinkedResource(local_58,&local_50,&local_98,LinkToFolder);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,
                              (ulong)(local_98.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var8);
    }
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksToSubprojects(
  cmXMLWriter& xml, const std::string& baseDir)
{
  if (!this->GenerateLinkedResources) {
    return;
  }

  // for each sub project create a linked resource to the source dir
  // - only if it is an out-of-source build
  cmExtraEclipseCDT4Generator::AppendLinkedResource(
    xml, "[Subprojects]", "virtual:/virtual", VirtualFolder);

  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    std::string linkSourceDirectory =
      cmExtraEclipseCDT4Generator::GetEclipsePath(
        it.second[0]->GetCurrentSourceDirectory());
    // a linked resource must not point to a parent directory of .project or
    // .project itself
    if ((baseDir != linkSourceDirectory) &&
        !cmSystemTools::IsSubDirectory(baseDir, linkSourceDirectory)) {
      std::string linkName = cmStrCat("[Subprojects]/", it.first);
      cmExtraEclipseCDT4Generator::AppendLinkedResource(
        xml, linkName,
        cmExtraEclipseCDT4Generator::GetEclipsePath(linkSourceDirectory),
        LinkToFolder);
      // Don't add it to the srcLinkedResources, because listing multiple
      // directories confuses the Eclipse indexer (#13596).
    }
  }
}